

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedEofInputStream::pumpTo
          (DelayedEofInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  Promise<unsigned_long> *in_RCX;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OStack_28;
  
  (**(code **)(*output[2]._vptr_AsyncOutputStream + 0x18))(&OStack_28);
  wrap<unsigned_long>(this,(unsigned_long)output,in_RCX);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&OStack_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
      return wrap(amount, inner->pumpTo(output, amount));
    }